

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

void __thiscall
google::protobuf::util::MessageDifferencer::StreamReporter::ReportMoved
          (StreamReporter *this,Message *message1,Message *param_2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *field_path)

{
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  
  text._M_str = "moved: ";
  text._M_len = 7;
  io::Printer::Print<>(this->printer_,text);
  (*(this->super_Reporter)._vptr_Reporter[9])(this,field_path,1);
  text_00._M_str = " -> ";
  text_00._M_len = 4;
  io::Printer::Print<>(this->printer_,text_00);
  (*(this->super_Reporter)._vptr_Reporter[9])(this,field_path,0);
  text_01._M_str = " : ";
  text_01._M_len = 3;
  io::Printer::Print<>(this->printer_,text_01);
  (*(this->super_Reporter)._vptr_Reporter[10])(this,message1,field_path,1);
  text_02._M_str = "\n";
  text_02._M_len = 1;
  io::Printer::Print<>(this->printer_,text_02);
  return;
}

Assistant:

void MessageDifferencer::StreamReporter::ReportMoved(
    const Message& message1, const Message& /*message2*/,
    const std::vector<SpecificField>& field_path) {
  printer_->Print("moved: ");
  PrintPath(field_path, true);
  printer_->Print(" -> ");
  PrintPath(field_path, false);
  printer_->Print(" : ");
  PrintValue(message1, field_path, true);
  printer_->Print("\n");  // Print for newlines.
}